

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O0

string * __thiscall OpenMD::OpenMD_itoa_abi_cxx11_(int value,uint base)

{
  uint uVar1;
  string *psVar2;
  uint in_EDX;
  uint in_ESI;
  string *in_RDI;
  int i;
  int _value;
  string sign;
  string buf;
  char digitMap [17];
  string local_a8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  int local_88;
  string local_80 [52];
  undefined4 local_4c;
  string local_48 [32];
  char local_28 [24];
  uint local_10;
  uint local_c;
  
  builtin_strncpy(local_28,"0123456789abcdef",0x11);
  local_10 = in_EDX;
  local_c = in_ESI;
  std::__cxx11::string::string(local_48);
  if ((local_10 == 0) || (0x10 < local_10)) {
    std::__cxx11::string::string((string *)in_RDI,local_48);
    local_4c = 1;
  }
  else if (local_c == 0) {
    std::__cxx11::string::operator=(local_48,"0");
    std::__cxx11::string::string((string *)in_RDI,local_48);
    local_4c = 1;
  }
  else {
    std::__cxx11::string::string(local_80);
    uVar1 = local_c;
    if ((int)local_c < 0) {
      uVar1 = -local_c;
      std::__cxx11::string::operator=(local_80,"-");
    }
    local_88 = 0x1e;
    for (; uVar1 != 0 && local_88 != 0; uVar1 = uVar1 / local_10) {
      std::operator+((char)(uVar1 >> 0x18),in_stack_ffffffffffffff70);
      std::__cxx11::string::operator=(local_48,local_a8);
      std::__cxx11::string::~string(local_a8);
      local_88 = local_88 + -1;
    }
    psVar2 = (string *)std::__cxx11::string::append(local_80);
    std::__cxx11::string::string((string *)in_RDI,psVar2);
    local_4c = 1;
    std::__cxx11::string::~string(local_80);
  }
  std::__cxx11::string::~string(local_48);
  return in_RDI;
}

Assistant:

std::string OpenMD_itoa(int value, unsigned int base) {
    const char digitMap[] = "0123456789abcdef";
    std::string buf;

    if (base == 0 || base > 16) { return buf; }

    if (value == 0) {
      buf = "0";
      return buf;
    }

    // Take care negative int:

    std::string sign;
    int _value = value;
    if (value < 0) {
      _value = -value;
      sign   = "-";
    }

    // Translating number to string with base:
    for (int i = 30; _value && i; --i) {
      buf = digitMap[_value % base] + buf;
      _value /= base;
    }
    return sign.append(buf);
  }